

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

image * __thiscall
basisu::image::fill_box_alpha(image *this,uint32_t x,uint32_t y,uint32_t w,uint32_t h,color_rgba *c)

{
  uint32_t iy;
  uint32_t uVar1;
  uint32_t x_00;
  uint32_t uVar2;
  bool bVar3;
  
  for (uVar1 = 0; uVar1 != h; uVar1 = uVar1 + 1) {
    x_00 = x;
    uVar2 = w;
    while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
      set_clipped_alpha(this,x_00,y + uVar1,c);
      x_00 = x_00 + 1;
    }
  }
  return this;
}

Assistant:

image& fill_box_alpha(uint32_t x, uint32_t y, uint32_t w, uint32_t h, const color_rgba& c)
		{
			for (uint32_t iy = 0; iy < h; iy++)
				for (uint32_t ix = 0; ix < w; ix++)
					set_clipped_alpha(x + ix, y + iy, c);
			return *this;
		}